

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O2

int Extra_zddLitCountComb(DdManager *dd,DdNode *zComb)

{
  int iVar1;
  
  if (dd->zero == zComb) {
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    for (; zComb != dd->one; zComb = (zComb->type).kids.T) {
      iVar1 = iVar1 + 1;
    }
  }
  return iVar1;
}

Assistant:

int Extra_zddLitCountComb( DdManager * dd, DdNode * zComb )
{
	int Counter;
	if ( zComb == z0 )
		return 0;
	Counter = 0;
	for ( ; zComb != z1; zComb = cuddT(zComb) )
		Counter++;
	return Counter;
}